

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O1

REF_STATUS ref_sort_search_int(REF_INT n,REF_INT *ascending_list,REF_INT target,REF_INT *position)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  *position = -1;
  if ((0 < n) && (*ascending_list <= target)) {
    uVar2 = n - 1;
    uVar3 = (ulong)uVar2;
    if (target <= ascending_list[uVar3]) {
      uVar1 = 0;
      if ((*ascending_list == target) || (uVar1 = uVar2, ascending_list[uVar3] == target)) {
LAB_001e39c3:
        *position = uVar1;
        return 0;
      }
      uVar1 = (uint)n >> 1;
      if ((int)uVar1 < (int)uVar2) {
        uVar2 = 0;
        do {
          if (target < ascending_list[uVar1]) {
            uVar3 = (ulong)uVar1;
          }
          else {
            uVar2 = uVar1;
            if (ascending_list[uVar1] == target) goto LAB_001e39c3;
          }
          uVar1 = (int)uVar3 + uVar2 >> 1;
        } while ((uVar2 < uVar1) && ((int)uVar1 < (int)uVar3));
      }
    }
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_sort_search_int(REF_INT n, REF_INT *ascending_list,
                                       REF_INT target, REF_INT *position) {
  REF_INT lower, upper, mid;

  *position = REF_EMPTY;

  if (n < 1) return REF_NOT_FOUND;

  if (target < ascending_list[0] || target > ascending_list[n - 1])
    return REF_NOT_FOUND;

  lower = 0;
  upper = n - 1;
  mid = n >> 1; /* fast divide by two */

  if (target == ascending_list[lower]) {
    *position = lower;
    return REF_SUCCESS;
  }
  if (target == ascending_list[upper]) {
    *position = upper;
    return REF_SUCCESS;
  }

  while ((lower < mid) && (mid < upper)) {
    if (target >= ascending_list[mid]) {
      if (target == ascending_list[mid]) {
        *position = mid;
        return REF_SUCCESS;
      }
      lower = mid;
    } else {
      upper = mid;
    }
    mid = (lower + upper) >> 1;
  }

  return REF_NOT_FOUND;
}